

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

CURLcode cf_h2_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  long *plVar1;
  undefined8 uVar2;
  CURLcode CVar3;
  ulong uVar4;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  plVar1 = (long *)cf->ctx;
  if ((cf->next->field_0x24 & 1) == 0) {
    CVar3 = Curl_conn_cf_connect(cf->next,data,blocking,done);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    if (*done != true) {
      return CURLE_OK;
    }
  }
  *done = false;
  uVar2 = *(undefined8 *)((long)cf->ctx + 0x10);
  *(Curl_easy **)((long)cf->ctx + 0x10) = data;
  if (((*plVar1 == 0) && (CVar3 = cf_h2_ctx_init(cf,data,false), CVar3 != CURLE_OK)) ||
     (CVar3 = h2_progress_ingress(cf,data), CVar3 != CURLE_OK)) {
    uVar4 = (ulong)CVar3;
  }
  else {
    CVar3 = h2_progress_egress(cf,data);
    if ((CVar3 == CURLE_AGAIN) || (uVar4 = (ulong)CVar3, CVar3 == CURLE_OK)) {
      *done = true;
      cf->field_0x24 = cf->field_0x24 | 1;
      uVar4 = 0;
    }
  }
  if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
     (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf,"cf_connect() -> %d, %d, ",uVar4,(ulong)*done);
  }
  *(undefined8 *)((long)cf->ctx + 0x10) = uVar2;
  return (CURLcode)uVar4;
}

Assistant:

static CURLcode cf_h2_connect(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool blocking, bool *done)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;
  struct cf_call_data save;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* Connect the lower filters first */
  if(!cf->next->connected) {
    result = Curl_conn_cf_connect(cf->next, data, blocking, done);
    if(result || !*done)
      return result;
  }

  *done = FALSE;

  CF_DATA_SAVE(save, cf, data);
  if(!ctx->h2) {
    result = cf_h2_ctx_init(cf, data, FALSE);
    if(result)
      goto out;
  }

  result = h2_progress_ingress(cf, data);
  if(result)
    goto out;

  /* Send out our SETTINGS and ACKs and such. If that blocks, we
   * have it buffered and  can count this filter as being connected */
  result = h2_progress_egress(cf, data);
  if(result == CURLE_AGAIN)
    result = CURLE_OK;
  else if(result)
    goto out;

  *done = TRUE;
  cf->connected = TRUE;
  result = CURLE_OK;

out:
  CURL_TRC_CF(data, cf, "cf_connect() -> %d, %d, ", result, *done);
  CF_DATA_RESTORE(cf, save);
  return result;
}